

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void vkt::BindingModel::anon_unknown_1::BufferRenderInstance::writeDescriptorSetWithTemplate
               (DeviceInterface *vki,VkDevice device,VkDescriptorSetLayout layout,
               VkDescriptorPool descriptorPool,VkDescriptorType descriptorType,
               ShaderInputInterface shaderInterface,VkBuffer bufferA,deUint32 offsetA,
               VkBuffer bufferB,deUint32 offsetB,VkDescriptorSet descriptorSet,
               Move<vk::Handle<(vk::HandleType)32>_> *updateTemplate,
               RawUpdateRegistry *updateRegistry,bool withPush,VkPipelineLayout pipelineLayout)

{
  deUint64 dVar1;
  RefData<vk::Handle<(vk::HandleType)32>_> data;
  size_t sVar2;
  size_type sVar3;
  Handle<(vk::HandleType)32> *pHVar4;
  deUint8 *pdVar5;
  Move<vk::Handle<(vk::HandleType)32>_> local_1d8;
  RefData<vk::Handle<(vk::HandleType)32>_> local_1b8;
  VkDescriptorUpdateTemplateEntryKHR local_198;
  VkDescriptorUpdateTemplateEntryKHR local_178;
  VkDescriptorUpdateTemplateEntryKHR local_158;
  VkDescriptorUpdateTemplateEntryKHR local_138;
  undefined1 local_108 [8];
  VkDescriptorUpdateTemplateCreateInfoKHR templateCreateInfo;
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  updateEntries;
  undefined1 local_98 [8];
  VkDescriptorBufferInfo bufferInfos [2];
  bool withPush_local;
  ShaderInputInterface shaderInterface_local;
  VkDescriptorType descriptorType_local;
  VkDevice device_local;
  DeviceInterface *vki_local;
  VkPipelineLayout pipelineLayout_local;
  VkDescriptorSet descriptorSet_local;
  VkBuffer bufferB_local;
  VkBuffer bufferA_local;
  VkDescriptorPool descriptorPool_local;
  VkDescriptorSetLayout layout_local;
  
  bufferInfos[1].range._7_1_ = withPush;
  ::vk::makeDescriptorBufferInfo((VkDescriptorBufferInfo *)local_98,bufferA,(ulong)offsetA,0x20);
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)&bufferInfos[0].range,bufferB,(ulong)offsetB,0x20);
  std::
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ::vector((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
            *)&templateCreateInfo.set);
  local_108._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR;
  templateCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  templateCreateInfo._4_4_ = 0;
  templateCreateInfo.pNext._0_4_ = 0;
  templateCreateInfo.pNext._4_4_ = 0;
  templateCreateInfo.flags = 0;
  templateCreateInfo.descriptorUpdateEntryCount = 0;
  templateCreateInfo.pDescriptorUpdateEntries._0_4_ = bufferInfos[1].range._7_1_ & 1;
  templateCreateInfo.descriptorSetLayout.m_internal._0_4_ = 0;
  templateCreateInfo._48_8_ = pipelineLayout.m_internal;
  templateCreateInfo.pipelineLayout.m_internal._0_4_ = 0;
  templateCreateInfo._32_8_ = layout.m_internal;
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorBufferInfo>
            (updateRegistry,(VkDescriptorBufferInfo *)local_98);
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorBufferInfo>
            (updateRegistry,(VkDescriptorBufferInfo *)&bufferInfos[0].range);
  if (shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    sVar2 = RawUpdateRegistry::getWriteObjectOffset(updateRegistry,0);
    createTemplateBinding(&local_138,0,0,1,descriptorType,sVar2,0);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_138);
  }
  else if (shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    sVar2 = RawUpdateRegistry::getWriteObjectOffset(updateRegistry,0);
    createTemplateBinding(&local_158,0,0,1,descriptorType,sVar2,0);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_158);
    sVar2 = RawUpdateRegistry::getWriteObjectOffset(updateRegistry,1);
    createTemplateBinding(&local_178,1,0,1,descriptorType,sVar2,0);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_178);
  }
  else if (shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    sVar2 = RawUpdateRegistry::getWriteObjectOffset(updateRegistry,0);
    createTemplateBinding(&local_198,0,0,2,descriptorType,sVar2,0x18);
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
    ::push_back((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                 *)&templateCreateInfo.set,&local_198);
  }
  templateCreateInfo._16_8_ =
       std::
       vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
       ::operator[]((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                     *)&templateCreateInfo.set,0);
  sVar3 = std::
          vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
          ::size((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
                  *)&templateCreateInfo.set);
  templateCreateInfo.pNext._4_4_ = (undefined4)sVar3;
  ::vk::createDescriptorUpdateTemplateKHR
            (&local_1d8,vki,device,(VkDescriptorUpdateTemplateCreateInfoKHR *)local_108,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1b8,(Move *)&local_1d8);
  data.deleter.m_deviceIface = local_1b8.deleter.m_deviceIface;
  data.object.m_internal = local_1b8.object.m_internal;
  data.deleter.m_device = local_1b8.deleter.m_device;
  data.deleter.m_allocator = local_1b8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)32>_>::operator=(updateTemplate,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)32>_>::~Move(&local_1d8);
  if ((bufferInfos[1].range._7_1_ & 1) == 0) {
    pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)32>_>::operator*
                       (&updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>);
    dVar1 = pHVar4->m_internal;
    pdVar5 = RawUpdateRegistry::getRawPointer(updateRegistry);
    (*vki->_vptr_DeviceInterface[0x92])(vki,device,descriptorSet.m_internal,dVar1,pdVar5);
  }
  std::
  vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
  ::~vector((vector<vk::VkDescriptorUpdateTemplateEntryKHR,_std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>_>
             *)&templateCreateInfo.set);
  return;
}

Assistant:

void BufferRenderInstance::writeDescriptorSetWithTemplate (const vk::DeviceInterface&						vki,
														   vk::VkDevice										device,
														   vk::VkDescriptorSetLayout						layout,
														   vk::VkDescriptorPool								descriptorPool,
														   vk::VkDescriptorType								descriptorType,
														   ShaderInputInterface								shaderInterface,
														   vk::VkBuffer										bufferA,
														   const deUint32									offsetA,
														   vk::VkBuffer										bufferB,
														   const deUint32									offsetB,
														   vk::VkDescriptorSet								descriptorSet,
														   vk::Move<vk::VkDescriptorUpdateTemplateKHR>&		updateTemplate,
														   RawUpdateRegistry&								updateRegistry,
														   bool												withPush,
														   vk::VkPipelineLayout								pipelineLayout)
{
	DE_UNREF(descriptorPool);
	const vk::VkDescriptorBufferInfo						bufferInfos[2]	=
	{
		vk::makeDescriptorBufferInfo(bufferA, (vk::VkDeviceSize)offsetA, (vk::VkDeviceSize)BUFFER_DATA_SIZE),
		vk::makeDescriptorBufferInfo(bufferB, (vk::VkDeviceSize)offsetB, (vk::VkDeviceSize)BUFFER_DATA_SIZE),
	};
	std::vector<vk::VkDescriptorUpdateTemplateEntryKHR>		updateEntries;
	vk::VkDescriptorUpdateTemplateCreateInfoKHR				templateCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR,
		DE_NULL,
		0,
		0,			// descriptorUpdateEntryCount
		DE_NULL,	// pDescriptorUpdateEntries
		withPush ? vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_PUSH_DESCRIPTORS_KHR : vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_DESCRIPTOR_SET_KHR,
		layout,
		vk::VK_PIPELINE_BIND_POINT_GRAPHICS,
		pipelineLayout,
		0
	};
	updateRegistry.addWriteObject(bufferInfos[0]);
	updateRegistry.addWriteObject(bufferInfos[1]);

	switch (shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			updateEntries.push_back(createTemplateBinding(0u, 0, 1, descriptorType, updateRegistry.getWriteObjectOffset(0), 0));
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			updateEntries.push_back(createTemplateBinding(0u, 0, 1, descriptorType, updateRegistry.getWriteObjectOffset(0), 0));
			updateEntries.push_back(createTemplateBinding(1u, 0, 1, descriptorType, updateRegistry.getWriteObjectOffset(1), 0));
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			updateEntries.push_back(createTemplateBinding(0u, 0, 2, descriptorType, updateRegistry.getWriteObjectOffset(0), sizeof(bufferInfos[0])));
			break;

		default:
			DE_FATAL("Impossible");
	}

	templateCreateInfo.pDescriptorUpdateEntries			= &updateEntries[0];
	templateCreateInfo.descriptorUpdateEntryCount		= (deUint32)updateEntries.size();

	updateTemplate										= vk::createDescriptorUpdateTemplateKHR(vki, device, &templateCreateInfo);

	if (!withPush)
	{
		vki.updateDescriptorSetWithTemplateKHR(device, descriptorSet, *updateTemplate, updateRegistry.getRawPointer());
	}
}